

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

CountExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadCountExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *this)

{
  int num_args;
  ExprBase EVar1;
  long lVar2;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
  BVar3;
  
  num_args = ReadNumArgs(this,1);
  BVar3 = BasicExprFactory<std::allocator<char>>::
          BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
                    ((BasicExprFactory<std::allocator<char>> *)this->handler_->builder_,COUNT,
                     num_args);
  if (0 < num_args) {
    lVar2 = 0;
    do {
      EVar1.impl_ = (Impl *)ReadLogicalExpr(this);
      ((ExprBase *)((long)BVar3.impl_ + (long)BVar3.arg_index_ * 8 + 8 + lVar2 * 8))->impl_ =
           EVar1.impl_;
      lVar2 = lVar2 + 1;
    } while (num_args != (int)lVar2);
  }
  return (CountExpr)&(BVar3.impl_)->super_Impl;
}

Assistant:

typename Handler::CountExpr ReadCountExpr() {
    int num_args = ReadNumArgs(1);
    typename Handler::CountArgHandler args = handler_.BeginCount(num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndCount(args);
  }